

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O0

int NV12Scale(uint8_t *src_y,int src_stride_y,uint8_t *src_uv,int src_stride_uv,int src_width,
             int src_height,uint8_t *dst_y,int dst_stride_y,uint8_t *dst_uv,int dst_stride_uv,
             int dst_width,int dst_height,FilterMode filtering)

{
  int in_ECX;
  long in_RDX;
  int in_ESI;
  uint8_t *in_RDI;
  int in_R8D;
  int in_R9D;
  int unaff_retaddr;
  int in_stack_00000008;
  undefined4 in_stack_0000000c;
  FilterMode in_stack_00000010;
  long in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int dst_halfheight;
  int dst_halfwidth;
  int src_halfheight;
  int src_halfwidth;
  int local_44;
  int local_40;
  int in_stack_ffffffffffffffe8;
  int local_4;
  
  if (in_R8D < 0) {
    local_40 = -(1 - in_R8D >> 1);
  }
  else {
    local_40 = in_R8D + 1 >> 1;
  }
  if (in_R9D < 0) {
    local_44 = -(1 - in_R9D >> 1);
  }
  else {
    local_44 = in_R9D + 1 >> 1;
  }
  if ((((((in_RDI == (uint8_t *)0x0) || (in_RDX == 0)) || (in_R8D == 0)) ||
       ((in_R9D == 0 || (0x8000 < in_R8D)))) ||
      ((0x8000 < in_R9D ||
       ((CONCAT44(in_stack_0000000c,in_stack_00000008) == 0 || (in_stack_00000018 == 0)))))) ||
     ((in_stack_00000028 < 1 || (dst_halfwidth < 1)))) {
    local_4 = -1;
  }
  else {
    ScalePlane((uint8_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),(int)((ulong)in_RDX >> 0x20),
               (int)in_RDX,in_ECX,(uint8_t *)CONCAT44(in_R9D,local_40),local_44,unaff_retaddr,
               in_stack_00000008,in_stack_00000010);
    UVScale(in_RDI,in_ESI,in_stack_ffffffffffffffe8,(int)((ulong)in_RDX >> 0x20),
            (uint8_t *)CONCAT44(in_ECX,in_R8D),in_R9D,in_stack_00000020,in_stack_00000028,
            dst_halfwidth);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int NV12Scale(const uint8_t* src_y,
              int src_stride_y,
              const uint8_t* src_uv,
              int src_stride_uv,
              int src_width,
              int src_height,
              uint8_t* dst_y,
              int dst_stride_y,
              uint8_t* dst_uv,
              int dst_stride_uv,
              int dst_width,
              int dst_height,
              enum FilterMode filtering) {
  int src_halfwidth = SUBSAMPLE(src_width, 1, 1);
  int src_halfheight = SUBSAMPLE(src_height, 1, 1);
  int dst_halfwidth = SUBSAMPLE(dst_width, 1, 1);
  int dst_halfheight = SUBSAMPLE(dst_height, 1, 1);
  if (!src_y || !src_uv || src_width == 0 || src_height == 0 ||
      src_width > 32768 || src_height > 32768 || !dst_y || !dst_uv ||
      dst_width <= 0 || dst_height <= 0) {
    return -1;
  }

  ScalePlane(src_y, src_stride_y, src_width, src_height, dst_y, dst_stride_y,
             dst_width, dst_height, filtering);
  UVScale(src_uv, src_stride_uv, src_halfwidth, src_halfheight, dst_uv,
          dst_stride_uv, dst_halfwidth, dst_halfheight, filtering);
  return 0;
}